

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O2

int cpu_exec_m68k(uc_struct_conflict3 *uc,CPUState *cpu)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUClass *pCVar4;
  TranslationBlock *pTVar5;
  long lVar6;
  CPUWatchpoint *pCVar7;
  _Bool _Var8;
  char cVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  tcg_target_ulong tVar13;
  target_ulong_conflict *ptVar14;
  TranslationBlock *pTVar15;
  uint uVar16;
  list_item *plVar17;
  ulong uVar18;
  long lVar19;
  anon_union_16_2_aaf24f3d_for_entry *paVar20;
  target_ulong_conflict *ptVar21;
  uint cf_mask;
  CPUClass *pCVar22;
  uint32_t cflags;
  bool bVar23;
  undefined1 auVar24 [16];
  target_ulong_conflict *ptStack_80;
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar22 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar22->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var8 = (*pCVar22->has_work)((CPUState_conflict *)cpu);
    if (!_Var8) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar22->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar10 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar10 != 0) {
    pCVar22 = cpu->cc;
  }
LAB_00662979:
  puVar2 = cpu->uc;
  uVar16 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var8 = (*puVar2->stop_interrupt)(puVar2,uVar16);
    if (_Var8) {
      plVar17 = (list_item *)(puVar2->hook + 0xe);
      goto LAB_00662e31;
    }
    uVar16 = cpu->exception_index;
  }
  if (-1 < (int)uVar16) {
    if (0xffff < uVar16) {
      if (uVar16 == 0x10002) {
        pCVar4 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          paVar20 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->watchpoints;
          while (pCVar7 = paVar20->tqe_next, pCVar7 != (CPUWatchpoint *)0x0) {
            *(byte *)&pCVar7->flags = (byte)pCVar7->flags & 0x3f;
            paVar20 = &pCVar7->entry;
          }
        }
        (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_00662eb7;
    }
    plVar17 = (list_item *)puVar2->hook;
    bVar23 = false;
    while ((plVar17 = plVar17->next, plVar17 != (list_item *)0x0 &&
           (pvVar3 = plVar17->data, pvVar3 != (void *)0x0))) {
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar23 = true;
      }
    }
    if (!bVar23) goto LAB_00662e8b;
    cpu->exception_index = -1;
  }
  ptStack_80 = (target_ulong_conflict *)0x0;
  ptVar21 = ptStack_80;
  while( true ) {
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x46a) = 0;
    uVar16 = cpu->interrupt_request;
    if (uVar16 != 0) {
      uVar11 = uVar16;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar11 = uVar16 & 0xffffeda5;
      }
      if ((char)uVar11 < '\0') {
        cpu->interrupt_request = uVar16 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_00662979;
      }
      if ((uVar11 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_00662979;
      }
      _Var8 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar11);
      if (_Var8) {
        cpu->exception_index = -1;
        ptVar21 = (target_ulong_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        ptVar21 = (target_ulong_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    pvVar3 = cpu->env_ptr;
    uVar16 = *(uint *)((long)pvVar3 + 0x40);
    uVar11 = *(uint *)((long)pvVar3 + 0x138) >> 4 & 0xf;
    if ((*(byte *)((long)pvVar3 + 0x45) & 0x20) != 0) {
      uVar11 = uVar11 + ((*(uint *)((long)pvVar3 + 0x180) & 4) << 0xd |
                        (*(uint *)((long)pvVar3 + 0x17c) & 4) << 0xc) + 0x2000;
    }
    puVar2 = cpu->uc;
    uVar12 = uVar16 >> 6 ^ uVar16;
    uVar12 = uVar12 & 0x3f | uVar12 >> 6 & 0xfc0;
    pTVar15 = cpu->tb_jmp_cache[uVar12];
    cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if (((((pTVar15 == (TranslationBlock *)0x0) || ((uint)pTVar15->pc != uVar16)) ||
         (*(int *)((long)&pTVar15->pc + 4) != 0)) ||
        (((uint32_t)pTVar15->cs_base != uVar11 ||
         (uVar1._0_2_ = pTVar15->size, uVar1._2_2_ = pTVar15->icount,
         cpu->trace_dstate[0] != (ulong)uVar1)))) || ((pTVar15->flags & 0xff0effff) != cf_mask)) {
      pTVar15 = tb_htable_lookup_m68k(cpu,(ulong)uVar16,0,uVar11,cf_mask);
      if (pTVar15 == (TranslationBlock *)0x0) {
        pTVar15 = (TranslationBlock *)tb_gen_code_m68k(cpu,uVar16,0,uVar11,cflags);
        cpu->tb_jmp_cache[uVar12] = pTVar15;
        pTVar5 = puVar2->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar15->pc;
          auVar24 = ZEXT416(*(uint *)((long)&pTVar15->cs_base + 4));
          auVar24 = pshuflw(auVar24,auVar24,0xe1);
          local_38 = auVar24._0_4_;
          local_50 = (ulong)(uint)pTVar5->pc;
          auVar24 = ZEXT416(*(uint *)((long)&pTVar5->cs_base + 4));
          auVar24 = pshuflw(auVar24,auVar24,0xe1);
          local_48 = auVar24._0_4_;
          plVar17 = (list_item *)(puVar2->hook + 0xf);
          while ((plVar17 = plVar17->next, plVar17 != (list_item *)0x0 &&
                 (pvVar3 = plVar17->data, pvVar3 != (void *)0x0))) {
            if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
               (uVar18 = (ulong)(uint)pTVar15->pc,
               *(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
               uVar18 <= *(ulong *)((long)pvVar3 + 0x20) &&
               *(ulong *)((long)pvVar3 + 0x18) <= uVar18)) {
              (**(code **)((long)pvVar3 + 0x28))
                        (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar12] = pTVar15;
      }
    }
    if ((ptVar21 != (target_ulong_conflict *)0x0) && (pTVar15->page_addr[0] == 0xffffffffffffffff))
    {
      if (1 < (uint)ptStack_80) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar15->flags & 0x40000) == 0) {
        LOCK();
        bVar23 = *(long *)(ptVar21 + (long)ptStack_80 * 2 + 0x20) == 0;
        if (bVar23) {
          *(TranslationBlock **)(ptVar21 + (long)ptStack_80 * 2 + 0x20) = pTVar15;
        }
        UNLOCK();
        if (bVar23) {
          *(uint32_t *)(*(long *)(ptVar21 + (long)ptStack_80 * 2 + 0x16) + *(long *)(ptVar21 + 6)) =
               (pTVar15->cflags -
               ((int)*(long *)(ptVar21 + (long)ptStack_80 * 2 + 0x16) + (int)*(long *)(ptVar21 + 6))
               ) + -4;
          *(uintptr_t *)(ptVar21 + (long)ptStack_80 * 2 + 0x1c) = pTVar15->jmp_target_arg[1];
          pTVar15->jmp_target_arg[1] = (ulong)ptVar21 | (ulong)ptStack_80;
        }
      }
    }
    if (cpu->exit_request == false) {
      tVar13 = cpu_tb_exec(cpu,pTVar15);
      cpu->uc->last_tb = pTVar15;
      ptVar14 = (target_ulong_conflict *)(tVar13 & 0xfffffffffffffffc);
      uVar16 = (uint)tVar13 & 3;
      ptStack_80 = (target_ulong_conflict *)(ulong)uVar16;
      ptVar21 = ptVar14;
      if (uVar16 == 3) {
        ptVar21 = (target_ulong_conflict *)0x0;
        ptStack_80 = (target_ulong_conflict *)0x3;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x8d)) {
          lVar6 = cpu->icount_budget;
          lVar19 = 0xffff;
          if (lVar6 < 0xffff) {
            lVar19 = lVar6;
          }
          uVar16 = (uint)lVar19;
          *(short *)(cpu[1].tb_jmp_cache + 0x8d) = (short)lVar19;
          cpu->icount_extra = lVar6 - (int)uVar16;
          ptVar21 = (target_ulong_conflict *)0x0;
          ptStack_80 = (target_ulong_conflict *)0x3;
          if (0 < (int)uVar16 && lVar6 - (int)uVar16 == 0) {
            uVar11 = 0x7fff;
            if (uVar16 < 0x7fff) {
              uVar11 = uVar16;
            }
            pTVar15 = (TranslationBlock *)
                      tb_gen_code_m68k(cpu,*ptVar14,ptVar14[1],ptVar14[2],uVar11 | 0x10000);
            (pTVar15->tc).size = (size_t)ptVar14;
            cpu_tb_exec(cpu,pTVar15);
            tb_phys_invalidate_m68k
                      ((TCGContext_conflict2 *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)pTVar15
                       ,0xffffffffffffffff);
            tcg_tb_remove_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx,pTVar15);
            ptVar21 = (target_ulong_conflict *)0x0;
            ptStack_80 = (target_ulong_conflict *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_00662979;
LAB_00662e8b:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
  goto LAB_00662ead;
  while ((*(char *)((long)pvVar3 + 0x14) != '\0' ||
         (cVar9 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
         cVar9 == '\0'))) {
LAB_00662e31:
    plVar17 = plVar17->next;
    if ((plVar17 == (list_item *)0x0) || (pvVar3 = plVar17->data, pvVar3 == (void *)0x0)) {
      puVar2->invalid_error = 10;
      break;
    }
  }
LAB_00662ead:
  uVar16 = 0x10001;
LAB_00662eb7:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar22->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar16;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}